

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_reportSolverOutcome(HModel *this,char *message)

{
  double dVar1;
  char *__format;
  double dVar2;
  double dVar3;
  
  __format = "%s: NOT-OPT";
  if (this->problemStatus == 0) {
    __format = "%s: OPTIMAL";
  }
  printf(__format);
  dVar2 = computePrObj(this);
  dVar1 = this->objective;
  dVar3 = 1.0;
  if (1.0 <= ABS(dVar2)) {
    dVar3 = ABS(dVar2);
  }
  if (dVar3 <= dVar1) {
    dVar3 = dVar1;
  }
  printf("%16s: PrObj=%20.10e; DuObj=%20.10e; DlObj=%g; Iter=%10d; %10.3f",dVar2,dVar1,
         ABS(dVar2 - dVar1) / dVar3,this->totalTime,(this->modelName)._M_dataplus._M_p,
         (ulong)(uint)this->numberIteration);
  if (this->problemStatus != 0) {
    util_reportModelStatus(this);
    return;
  }
  putchar(10);
  return;
}

Assistant:

void HModel::util_reportSolverOutcome(const char *message) {
#ifdef JAJH_dev
#else
  //  if (!intOption[INTOPT_PRINT_FLAG]) return;
#endif
  if (problemStatus == LP_Status_Optimal)
    printf("%s: OPTIMAL", message);
  else
    printf("%s: NOT-OPT", message);
#ifdef SCIP_dev
  double prObjVal = computePrObj();
  double dlObjVal = abs(prObjVal-objective)/max(objective, max(abs(prObjVal), 1.0));
  printf("%16s: PrObj=%20.10e; DuObj=%20.10e; DlObj=%g; Iter=%10d; %10.3f", modelName.c_str(),
	 prObjVal, objective, dlObjVal, numberIteration, totalTime);
#else
  printf("%16s %20.10e %10d %10.3f", modelName.c_str(),
	 objective, numberIteration, totalTime);
#endif
  if (problemStatus == LP_Status_Optimal)
    printf("\n");
  else
    util_reportModelStatus();
}